

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodeproj.cc
# Opt level: O0

RC __thiscall QL_NodeProj::SetUpNode(QL_NodeProj *this,int numAttrToKeep)

{
  int *piVar1;
  char *pcVar2;
  int local_20 [2];
  int bufLength;
  int attrsInRecSize;
  RC rc;
  int numAttrToKeep_local;
  QL_NodeProj *this_local;
  
  bufLength = 0;
  attrsInRecSize = numAttrToKeep;
  _rc = this;
  piVar1 = (int *)malloc((long)numAttrToKeep << 2);
  (this->super_QL_Node).attrsInRec = piVar1;
  memset((this->super_QL_Node).attrsInRec,0,8);
  local_20[1] = 0;
  QL_Node::GetTupleLength(this->prevNode,local_20);
  pcVar2 = (char *)malloc((long)local_20[0]);
  this->buffer = pcVar2;
  memset(this->buffer,0,8);
  (this->super_QL_Node).listsInitialized = true;
  return 0;
}

Assistant:

RC QL_NodeProj::SetUpNode(int numAttrToKeep){
  RC rc = 0;
  // malloc the list of attributes to keep
  attrsInRec = (int *)malloc(numAttrToKeep * sizeof(int));
  memset((void*)attrsInRec, 0, sizeof(attrsInRec));
  int attrsInRecSize = 0;

  // malloc the buffer to keep the data for a tuple passed
  // up from the previous node
  int bufLength;
  prevNode.GetTupleLength(bufLength);
  buffer = (char *)malloc(bufLength);
  memset((void*) buffer, 0, sizeof(buffer));
  listsInitialized = true;

  return (0);
}